

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetOutputFormat_abi_cxx11_(void)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  ulong uVar2;
  string *in_RDI;
  char *colon;
  char *gtest_output_flag;
  string *__a;
  undefined4 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcc;
  byte bVar3;
  allocator in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  byte bVar4;
  allocator<char> in_stack_ffffffffffffffcf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  allocator<char> local_11;
  char *local_10;
  
  __a = in_RDI;
  local_10 = (char *)std::__cxx11::string::c_str();
  if (local_10 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,
               (char *)CONCAT17(in_stack_ffffffffffffffcf,
                                CONCAT16(in_stack_ffffffffffffffce,
                                         CONCAT15(in_stack_ffffffffffffffcd,
                                                  CONCAT14(in_stack_ffffffffffffffcc,
                                                           in_stack_ffffffffffffffc8)))),
               (allocator<char> *)__a);
    std::allocator<char>::~allocator(&local_11);
  }
  else {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           strchr(local_10,0x3a);
    pcVar1 = local_10;
    bVar4 = 0;
    bVar3 = 0;
    if (this == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::allocator<char>::allocator();
      bVar4 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)CONCAT17(in_stack_ffffffffffffffcf,
                                       CONCAT16(1,CONCAT15(in_stack_ffffffffffffffcd,
                                                           CONCAT14(bVar3,in_stack_ffffffffffffffc8)
                                                          ))),(allocator<char> *)__a);
    }
    else {
      uVar2 = (long)this - (long)local_10;
      std::allocator<char>::allocator();
      bVar3 = 1;
      std::__cxx11::string::string
                ((string *)in_RDI,pcVar1,uVar2,(allocator *)&stack0xffffffffffffffcd);
    }
    if ((bVar3 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcd);
    }
    if ((bVar4 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
    }
  }
  return __a;
}

Assistant:

std::string UnitTestOptions::GetOutputFormat() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL) return std::string("");

  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == NULL) ?
      std::string(gtest_output_flag) :
      std::string(gtest_output_flag, colon - gtest_output_flag);
}